

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall BanMan::SweepBanned(BanMan *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  string_view source_file;
  bool bVar3;
  bool bVar4;
  int64_t iVar5;
  _Base_ptr p_Var6;
  Logger *pLVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  iterator __position;
  banmap_t *category;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string local_130;
  CSubNet sub_net;
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = GetTime();
  bVar4 = false;
  __position._M_node = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node !=
         &(this->m_banned)._M_t._M_impl.super__Rb_tree_header) {
    CSubNet::CSubNet(&sub_net,(CSubNet *)(__position._M_node + 1));
    p_Var2 = __position._M_node[3]._M_parent;
    bVar3 = CSubNet::IsValid(&sub_net);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if (!bVar3 || (long)p_Var2 < iVar5) {
      category = &this->m_banned;
      std::
      _Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
      ::erase_abi_cxx11_((_Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
                          *)&this->m_banned,__position);
      this->m_is_dirty = true;
      bVar4 = ::LogAcceptCategory((LogFlags)category,(Level)__position._M_node);
      if (bVar4) {
        CSubNet::ToString_abi_cxx11_(&local_130,&sub_net);
        bVar4 = true;
        pLVar7 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar7);
        if (bVar3) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string>
                    (&local_78,(tinyformat *)"Removed banned node address/subnet: %s\n",
                     (char *)&local_130,in_RCX);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar7 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x53;
          local_78._M_string_length = 0x6dfe90;
          in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/banman.cpp"
          ;
          source_file._M_len = 0x53;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function._M_str = "SweepBanned";
          logging_function._M_len = 0xb;
          BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0xc4,NET,Debug);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        std::__cxx11::string::~string((string *)&local_130);
      }
      else {
        bVar4 = true;
      }
    }
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&sub_net);
    __position._M_node = p_Var6;
  }
  if ((bVar4) && (this->m_client_interface != (CClientUIInterface *)0x0)) {
    CClientUIInterface::BannedListChanged(this->m_client_interface);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::SweepBanned()
{
    AssertLockHeld(m_banned_mutex);

    int64_t now = GetTime();
    bool notify_ui = false;
    banmap_t::iterator it = m_banned.begin();
    while (it != m_banned.end()) {
        CSubNet sub_net = (*it).first;
        CBanEntry ban_entry = (*it).second;
        if (!sub_net.IsValid() || now > ban_entry.nBanUntil) {
            m_banned.erase(it++);
            m_is_dirty = true;
            notify_ui = true;
            LogDebug(BCLog::NET, "Removed banned node address/subnet: %s\n", sub_net.ToString());
        } else {
            ++it;
        }
    }

    // update UI
    if (notify_ui && m_client_interface) {
        m_client_interface->BannedListChanged();
    }
}